

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzdohrstructmatrix.cpp
# Opt level: O2

int __thiscall
TPZDohrStructMatrix<double,_TPZStructMatrixOR<double>_>::ClusterIslands
          (TPZDohrStructMatrix<double,_TPZStructMatrixOR<double>_> *this,TPZVec<int> *domain_index,
          int nsub,int connectdimension)

{
  _Rb_tree_color _Var1;
  uint uVar2;
  long lVar3;
  TPZCompEl *pTVar4;
  int *piVar5;
  int iVar6;
  undefined4 uVar7;
  int iVar8;
  TPZCompEl **ppTVar9;
  mapped_type_conflict4 *pmVar10;
  TPZGeoEl *pTVar11;
  TPZGeoEl *pTVar12;
  _Rb_tree_color *p_Var13;
  _Rb_tree_node_base *p_Var14;
  ulong uVar15;
  int iVar16;
  long lVar17;
  _Self __tmp;
  long lVar18;
  long size;
  ulong uVar19;
  int64_t iVar20;
  long lVar21;
  int iVar22;
  long lVar23;
  set<int,_std::less<int>,_std::allocator<int>_> *psVar24;
  bool bVar25;
  int mydomainindex;
  int celdomain;
  long local_1d0;
  TPZVec<int> *local_1c8;
  int local_1bc;
  int local_1b8;
  int local_1b4;
  TPZGeoElSide gelside;
  TPZVec<std::set<int,_std::less<int>,_std::allocator<int>_>_> domain_neighbours;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> domain_index_count;
  TPZManVector<int,_10> domain_dest;
  
  iVar16 = *(int *)(*(long *)&this->field_0x8 + 0x7e8);
  lVar3 = *(long *)(*(long *)&this->field_0x8 + 0x48);
  size = (long)nsub;
  local_1c8 = domain_index;
  local_1bc = nsub;
  TPZVec<std::set<int,_std::less<int>,_std::allocator<int>_>_>::TPZVec(&domain_neighbours,size);
  domain_index_count._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &domain_index_count._M_t._M_impl.super__Rb_tree_header._M_header;
  domain_index_count._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  domain_index_count._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  domain_index_count._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  lVar21 = lVar3;
  if (lVar3 < 1) {
    lVar21 = 0;
  }
  local_1b8 = connectdimension;
  domain_index_count._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       domain_index_count._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (lVar23 = 0; lVar23 != lVar21; lVar23 = lVar23 + 1) {
    ppTVar9 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                        ((TPZChunkVector<TPZCompEl_*,_10> *)(*(long *)&this->field_0x8 + 0x40),
                         lVar23);
    pTVar4 = *ppTVar9;
    if (pTVar4 != (TPZCompEl *)0x0) {
      mydomainindex = local_1c8->fStore[pTVar4->fIndex];
      pmVar10 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                operator[](&domain_index_count,&mydomainindex);
      *pmVar10 = *pmVar10 + 1;
      pTVar11 = TPZCompEl::Reference(pTVar4);
      if (pTVar11 != (TPZGeoEl *)0x0) {
        iVar6 = (**(code **)(*(long *)pTVar11 + 0xf0))(pTVar11);
        uVar7 = (**(code **)(*(long *)pTVar11 + 0x210))(pTVar11);
        local_1d0 = CONCAT44(local_1d0._4_4_,uVar7);
        local_1b4 = iVar6 + -1;
        iVar22 = 0;
        if (iVar6 < 1) {
          iVar6 = iVar22;
        }
        for (; iVar22 != iVar6; iVar22 = iVar22 + 1) {
          iVar8 = (**(code **)(*(long *)pTVar11 + 0x208))(pTVar11,iVar22);
          if (((int)local_1d0 < connectdimension || iVar8 == connectdimension) &&
             ((int)local_1d0 >= connectdimension || iVar22 == local_1b4)) {
            gelside.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_0172da80;
            gelside.fSide = iVar22;
            gelside.fGeoEl = pTVar11;
            TPZStack<TPZCompElSide,_10>::TPZStack((TPZStack<TPZCompElSide,_10> *)&domain_dest);
            TPZGeoElSide::ConnectedCompElementList
                      (&gelside,(TPZStack<TPZCompElSide,_10> *)&domain_dest,0,0);
            iVar20 = domain_dest.super_TPZVec<int>.fNElements;
            if (domain_dest.super_TPZVec<int>.fNElements < 1) {
              iVar20 = 0;
            }
            lVar18 = 0;
            lVar17 = 0;
            while (connectdimension = local_1b8, bVar25 = iVar20 != 0, iVar20 = iVar20 + -1, bVar25)
            {
              pTVar4 = *(TPZCompEl **)((long)domain_dest.super_TPZVec<int>.fStore + lVar18);
              pTVar12 = TPZCompEl::Reference(pTVar4);
              iVar8 = (**(code **)(*(long *)pTVar12 + 0x210))(pTVar12);
              if (iVar8 == iVar16) {
                celdomain = local_1c8->fStore[pTVar4->fIndex];
                if (celdomain != mydomainindex) {
                  std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
                  _M_insert_unique<int_const&>
                            ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                              *)(domain_neighbours.fStore + mydomainindex),&celdomain);
                }
                lVar17 = lVar17 + 1;
              }
              lVar18 = lVar18 + 0x10;
            }
            if (lVar17 == 0) {
              celdomain = -1;
              std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
              _M_insert_unique<int>(&domain_neighbours.fStore[mydomainindex]._M_t,&celdomain);
            }
            TPZManVector<TPZCompElSide,_10>::~TPZManVector
                      ((TPZManVector<TPZCompElSide,_10> *)&domain_dest);
          }
        }
      }
    }
  }
  gelside.super_TPZSavable._vptr_TPZSavable._0_4_ = 0xffffffff;
  TPZManVector<int,_10>::TPZManVector(&domain_dest,size,(int *)&gelside);
  lVar21 = 0;
  for (mydomainindex = 0; iVar16 = (int)lVar21, mydomainindex < local_1bc;
      mydomainindex = mydomainindex + 1) {
    if (domain_neighbours.fStore[mydomainindex]._M_t._M_impl.super__Rb_tree_header._M_node_count ==
        1) {
      lVar23 = (long)(int)domain_neighbours.fStore[mydomainindex]._M_t._M_impl.super__Rb_tree_header
                          ._M_header._M_left[1]._M_color;
      if (lVar23 != -1) {
        if (domain_dest.super_TPZVec<int>.fStore[lVar23] == -1) {
          if (domain_dest.super_TPZVec<int>.fStore[mydomainindex] == -1) {
            domain_dest.super_TPZVec<int>.fStore[mydomainindex] = iVar16;
            domain_dest.super_TPZVec<int>.fStore[lVar23] = iVar16;
            lVar21 = lVar21 + 1;
          }
          else {
            domain_dest.super_TPZVec<int>.fStore[lVar23] =
                 domain_dest.super_TPZVec<int>.fStore[mydomainindex];
          }
        }
        else {
          domain_dest.super_TPZVec<int>.fStore[mydomainindex] =
               domain_dest.super_TPZVec<int>.fStore[lVar23];
        }
      }
    }
    else if (domain_dest.super_TPZVec<int>.fStore[mydomainindex] == -1) {
      pmVar10 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                operator[](&domain_index_count,&mydomainindex);
      lVar23 = (long)mydomainindex;
      if ((long)*pmVar10 < (lVar3 / size) / 0x14) {
        gelside.fGeoEl = (TPZGeoEl *)((ulong)gelside.fGeoEl & 0xffffffff00000000);
        gelside.fSide = 0;
        gelside._20_4_ = 0;
        psVar24 = domain_neighbours.fStore;
        iVar16 = mydomainindex;
        local_1d0 = lVar21;
        for (p_Var14 = domain_neighbours.fStore[lVar23]._M_t._M_impl.super__Rb_tree_header._M_header
                       ._M_left;
            (_Rb_tree_header *)p_Var14 != &psVar24[iVar16]._M_t._M_impl.super__Rb_tree_header;
            p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14)) {
          _Var1 = p_Var14[1]._M_color;
          if (_Var1 != ~_S_red) {
            pmVar10 = std::
                      map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                      operator[](&domain_index_count,&mydomainindex);
            p_Var13 = (_Rb_tree_color *)
                      std::
                      map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                      operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                  *)&gelside,pmVar10);
            *p_Var13 = _Var1;
            psVar24 = domain_neighbours.fStore;
            iVar16 = mydomainindex;
          }
        }
        lVar21 = std::_Rb_tree_decrement((_Rb_tree_node_base *)&gelside.fGeoEl);
        celdomain = *(int *)(lVar21 + 0x24);
        pmVar10 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                  operator[](&domain_index_count,&celdomain);
        iVar16 = *pmVar10;
        pmVar10 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                  operator[](&domain_index_count,&mydomainindex);
        iVar6 = *pmVar10;
        pmVar10 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                  operator[](&domain_index_count,&celdomain);
        *pmVar10 = iVar6 + iVar16;
        pmVar10 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                  operator[](&domain_index_count,&mydomainindex);
        *pmVar10 = 0;
        if (domain_dest.super_TPZVec<int>.fStore[celdomain] == -1) {
          domain_dest.super_TPZVec<int>.fStore[celdomain] = (int)local_1d0;
          domain_dest.super_TPZVec<int>.fStore[mydomainindex] = (int)local_1d0;
          lVar21 = local_1d0 + 1;
        }
        else {
          domain_dest.super_TPZVec<int>.fStore[mydomainindex] =
               domain_dest.super_TPZVec<int>.fStore[celdomain];
          lVar21 = local_1d0;
        }
        std::
        _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
        ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                     *)&gelside);
      }
      else if (domain_dest.super_TPZVec<int>.fStore[lVar23] == -1) {
        domain_dest.super_TPZVec<int>.fStore[lVar23] = iVar16;
        lVar21 = lVar21 + 1;
      }
    }
  }
  uVar2 = (uint)local_1c8->fNElements;
  piVar5 = local_1c8->fStore;
  uVar19 = 0;
  uVar15 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar15 = uVar19;
  }
  for (; uVar15 != uVar19; uVar19 = uVar19 + 1) {
    piVar5[uVar19] = domain_dest.super_TPZVec<int>.fStore[piVar5[uVar19]];
  }
  TPZManVector<int,_10>::~TPZManVector(&domain_dest);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree(&domain_index_count._M_t);
  TPZVec<std::set<int,_std::less<int>,_std::allocator<int>_>_>::~TPZVec(&domain_neighbours);
  return iVar16;
}

Assistant:

int  TPZDohrStructMatrix<TVar,TPar>::ClusterIslands(TPZVec<int> &domain_index,int nsub,int connectdimension)
{
    int meshdim = this->fMesh->Dimension();
    int64_t nel = this->fMesh->NElements();
    int64_t mincount = nel/nsub/20;
    // contains for each subdomain the set of neighbouring domains
    TPZVec<std::set<int> > domain_neighbours(nsub);
    // contains for each domain the number of cells within that domain
    std::map<int,int> domain_index_count;
    int64_t iel;
    for (iel=0; iel<nel; iel++) {
        TPZCompEl *cel = this->fMesh->ElementVec()[iel];
        if (!cel) {
            continue;
        }
        int mydomainindex = domain_index[cel->Index()];
        //        if (mydomainindex == 0) {
        //            std::stringstream sout;
        //            cel->Print(sout);
        //            TPZGeoEl *gel = cel->Reference();
        //            if (gel) {
        //                gel->Print(sout);
        //            }
        //            LOGPZ_DEBUG(logger, sout.str())
        //        }
        domain_index_count[mydomainindex]++;
        TPZGeoEl *gel = cel->Reference();
        if (!gel) {
            continue;
        }
        int nsides = gel->NSides();
        int geldim = gel->Dimension();
        int is;
        for (is=0; is<nsides; is++) {
            int sidedim = gel->SideDimension(is);
            if (sidedim != connectdimension && geldim>=connectdimension) {
                continue;
            }
            if (geldim < connectdimension && is != nsides-1)
            {
                continue;
            }
            TPZGeoElSide gelside(gel,is);
            TPZStack<TPZCompElSide> elsidevec;
            gelside.ConnectedCompElementList(elsidevec, 0, 0);
            int64_t nneigh = elsidevec.NElements();
            int64_t neigh;
            int64_t nneighvalid = 0;
            for (neigh = 0; neigh <nneigh; neigh++) {
                TPZCompElSide celside = elsidevec[neigh];
                TPZCompEl *celloc = celside.Element();
                TPZGeoEl *gelloc = celloc->Reference();
                if (gelloc->Dimension() != meshdim) {
                    continue;
                }
                nneighvalid++;
                int celdomain = domain_index[celloc->Index()];
                if (celdomain != mydomainindex)
                {
                    domain_neighbours[mydomainindex].insert(celdomain);
                }
            }
            if (nneighvalid == 0)
            {
                // include the boundary as a ficticious neighbour index
                domain_neighbours[mydomainindex].insert(-1);
            }
        }
    }
#ifdef PZ_LOG
    if(logger.isDebugEnabled())
    {
        std::stringstream sout;
        for (int64_t i=0; i<domain_neighbours.size(); i++) {
            std::set<int>::const_iterator it;
            sout << "Domain index " << i << " neighbours ";
            for (it=domain_neighbours[i].begin(); it != domain_neighbours[i].end(); it++) {
                sout << *it << " ";
            }
            sout << std::endl;
        }
        std::map<int,int>::const_iterator it = domain_index_count.begin();
        while (it != domain_index_count.end()) {
            sout << "Domain index " << it->first << " number of elements " << it->second << std::endl;
            it++;
        }
        LOGPZ_DEBUG(logger, sout.str())
        
    }
#endif
    // compute a destination domain index for each domain (used for clustering domains)
    int isub;
    TPZManVector<int> domain_dest(nsub,-1);
    int64_t count = 0;
    for (isub=0; isub < nsub; isub++)
    {
        // if the subdomain is neighbour to only one subdomain
        // this means that the subdomain is isolated (only boundaries as neighbours) (not treated)
        // or that the domain is embedded in another domain
        if (domain_neighbours[isub].size() == 1 )
        {
            // merge both subdomains
            int target = *(domain_neighbours[isub].begin());
            // target == -1 is not treated here
            if (target == -1) {
                continue;
            }
            if (domain_dest[target] == -1 && domain_dest[isub] == -1)
            {
                domain_dest[isub] = count;
                domain_dest[target] = count;
                count++;
            }
            else if (domain_dest[target] == -1)
            {
                domain_dest[target] = domain_dest[isub];
            }
            else
            {
                domain_dest[isub] = domain_dest[target];
            }
            
        }
        else if(domain_dest[isub] == -1 && domain_index_count[isub] < mincount)
        {
            // the domain has very little elements
            // the domain has at least two neighbouring domains (may include the ficticious -1 domain)
            std::map<int,int> sizeDomain;
            std::set<int>::iterator it;
            for (it = domain_neighbours[isub].begin(); it != domain_neighbours[isub].end(); it++) {
                if (*it != -1) {
                    sizeDomain[domain_index_count[isub]] = *it;
                }
            }
            int domaintargetindex = sizeDomain.rbegin()->second;
            int destdomainindexcount = domain_index_count[domaintargetindex];
            int domainshrinkcount = domain_index_count[isub];
            domain_index_count[domaintargetindex] = destdomainindexcount+domainshrinkcount;
            domain_index_count[isub] = 0;
            if(domain_dest[domaintargetindex] == -1)
            {
                domain_dest[domaintargetindex] = count;
                domain_dest[isub] = count;
                count++;
            }
            else {
                domain_dest[isub] = domain_dest[domaintargetindex];
            }
            
        }
        else if (domain_dest[isub] == -1)
        {
            domain_dest[isub] = count++;
        }
    }
#ifdef PZ_LOG
    if (logger.isDebugEnabled())
    {
        std::stringstream sout;
        int isub;
        for (isub=0; isub < nsub; isub++) {
            sout << "isub = " << isub << " number of neighbours " << domain_neighbours[isub].size() << " domains ";
            std::set<int>::iterator it;
            for (it = domain_neighbours[isub].begin(); it != domain_neighbours[isub].end(); it++) {
                sout << *it << " ";
            }
            sout << std::endl;
        }
        sout << "Destination domain " << domain_dest << std::endl;
        LOGPZ_DEBUG(logger,sout.str())
    }
#endif
    int domsize = domain_index.NElements();
    int d;
    for (d=0; d<domsize; d++) {
        domain_index[d] = domain_dest[domain_index[d]];
    }
#ifdef PZ_LOG
    if (logger.isDebugEnabled())
    {
        std::stringstream sout;
        sout << "Number of elements per domain ";
        std::map<int,int>::iterator it;
        int64_t count = 0;
        for (it=domain_index_count.begin(); it != domain_index_count.end(); it++) {
            if (! (count++ %40)) {
                sout << std::endl;
            }
            sout << it->first << " " << it->second << " ";
        }
        LOGPZ_DEBUG(logger,sout.str())
    }
#endif
    
    return count;
}